

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

string * __thiscall
Catch::StringMaker<unsigned_long_long,void>::convert_abi_cxx11_
          (string *__return_storage_ptr__,StringMaker<unsigned_long_long,void> *this,
          unsigned_long_long value)

{
  ReusableStringStream rss;
  char local_31;
  ReusableStringStream local_30;
  
  ReusableStringStream::ReusableStringStream(&local_30);
  std::ostream::_M_insert<unsigned_long_long>((ulonglong)local_30.m_oss);
  if ((StringMaker<unsigned_long_long,void> *)0xff < this) {
    std::__ostream_insert<char,std::char_traits<char>>(local_30.m_oss," (0x",4);
    *(uint *)(local_30.m_oss + *(long *)(*(long *)local_30.m_oss + -0x18) + 0x18) =
         *(uint *)(local_30.m_oss + *(long *)(*(long *)local_30.m_oss + -0x18) + 0x18) & 0xffffffb5
         | 8;
    std::ostream::_M_insert<unsigned_long_long>((ulonglong)local_30.m_oss);
    local_31 = ')';
    std::__ostream_insert<char,std::char_traits<char>>(local_30.m_oss,&local_31,1);
  }
  std::__cxx11::stringbuf::str();
  ReusableStringStream::~ReusableStringStream(&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string StringMaker<unsigned long long>::convert(unsigned long long value) {
    ReusableStringStream rss;
    rss << value;
    if (value > Detail::hexThreshold) {
        rss << " (0x" << std::hex << value << ')';
    }
    return rss.str();
}